

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O1

void __thiscall
powerpc_test_cpu::test_instruction_RRI__(powerpc_test_cpu *this,char *insn,uint32_t opcode)

{
  uint a2;
  uint32_t a1;
  long lVar1;
  long lVar2;
  
  if (test_instruction_RRI__(char_const*,unsigned_int)::code == '\0') {
    test_instruction_RRI__();
  }
  lVar1 = 0;
  do {
    a2 = imm_values[lVar1];
    test_instruction_RRI__::code[0] = a2 & 0xffff | opcode & 0xffff0000;
    test_instruction_RRI__::code[3] = a2 & 0xffff | opcode & 0xffe00000;
    lVar2 = 0;
    do {
      a1 = *(uint32_t *)((long)reg_values + lVar2);
      test_one(this,test_instruction_RRI__::code,insn,a1,a2,0,0);
      test_one(this,test_instruction_RRI__::code + 2,insn,a1,a2,0,0);
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x90);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x24);
  return;
}

Assistant:

void powerpc_test_cpu::test_instruction_RRI__(const char *insn, uint32_t opcode)
{
	// Test code
	static uint32_t code[] = {
		POWERPC_ILLEGAL, POWERPC_BLR,
		POWERPC_MR(0, RA), POWERPC_ILLEGAL, POWERPC_BLR
	};

	// Input values
	const int n_reg_values = sizeof(reg_values)/sizeof(reg_values[0]);
	const int n_imm_values = sizeof(imm_values)/sizeof(imm_values[0]);

	for (int j = 0; j < n_imm_values; j++) {
		const uint32_t im = imm_values[j];
		uint32_t op = opcode;
		UIMM_field::insert(op, im);
		code[0] = code[3] = op;				// <op> RD,RA,IM
		rA_field::insert(code[3], 0);		// <op> RD,R0,IM
		flush_icache_range(code, sizeof(code));
		for (int i = 0; i < n_reg_values; i++) {
			const uint32_t ra = reg_values[i];
			test_one(&code[0], insn, ra, im, 0);
			test_one(&code[2], insn, ra, im, 0);
		}
	}
}